

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lucky.c
# Opt level: O3

uint Kit_TruthSemiCanonicize_new(uint *pInOut,uint *pAux,int nVars,char *pCanonPerm)

{
  uint uVar1;
  word Temp;
  word local_18;
  
  if (nVars < 6) {
    local_18 = CONCAT44(*pInOut,*pInOut);
    uVar1 = Kit_TruthSemiCanonicize_new_internal(&local_18,nVars,pCanonPerm);
    *pInOut = (uint)local_18;
    return uVar1;
  }
  uVar1 = Kit_TruthSemiCanonicize_new_internal((word *)pInOut,nVars,pCanonPerm);
  return uVar1;
}

Assistant:

unsigned Kit_TruthSemiCanonicize_new( unsigned * pInOut, unsigned * pAux, int nVars, char * pCanonPerm )
{
    unsigned Result;
    if ( nVars < 6 )
    {
         word Temp = ((word)pInOut[0] << 32) | (word)pInOut[0];
         Result = Kit_TruthSemiCanonicize_new_internal( &Temp, nVars, pCanonPerm );
         pInOut[0] = (unsigned)Temp;
    }
    else
         Result = Kit_TruthSemiCanonicize_new_internal( (word *)pInOut, nVars, pCanonPerm );
    return Result;
}